

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.h
# Opt level: O0

TSStateId ts_language_next_state(TSLanguage *self,TSStateId state,TSSymbol symbol)

{
  TSParseAction TVar1;
  TSParseAction *pTVar2;
  TSStateId local_30;
  byte bStack_2a;
  TSParseAction action;
  TSParseAction *actions;
  uint32_t count;
  TSSymbol symbol_local;
  TSStateId state_local;
  TSLanguage *self_local;
  
  if ((symbol == 0xffff) || (symbol == 0xfffe)) {
    self_local._6_2_ = 0;
  }
  else if ((uint)symbol < self->token_count) {
    actions._4_2_ = symbol;
    actions._6_2_ = state;
    _count = self;
    pTVar2 = ts_language_actions(self,state,symbol,(uint32_t *)&actions);
    if ((int)actions != 0) {
      TVar1 = pTVar2[(int)actions - 1];
      bStack_2a = TVar1._6_1_;
      if ((((ulong)TVar1 & 0xf000000000000) == 0) || ((bStack_2a & 0xf) == 3)) {
        local_30 = TVar1.params._0_2_;
        return local_30;
      }
    }
    self_local._6_2_ = 0;
  }
  else {
    self_local._6_2_ = self->parse_table[(uint)state * self->symbol_count + (uint)symbol];
  }
  return self_local._6_2_;
}

Assistant:

static inline TSStateId ts_language_next_state(const TSLanguage *self,
                                               TSStateId state,
                                               TSSymbol symbol) {
  if (symbol == ts_builtin_sym_error || symbol == ts_builtin_sym_error_repeat) {
    return 0;
  } else if (symbol < self->token_count) {
    uint32_t count;
    const TSParseAction *actions = ts_language_actions(self, state, symbol, &count);
    if (count > 0) {
      TSParseAction action = actions[count - 1];
      if (action.type == TSParseActionTypeShift || action.type == TSParseActionTypeRecover) {
        return action.params.state;
      }
    }
    return 0;
  } else {
    return self->parse_table[state * self->symbol_count + symbol];
  }
}